

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# volume_mesh_color_quantity.cpp
# Opt level: O0

void __thiscall
polyscope::VolumeMeshColorQuantity::VolumeMeshColorQuantity
          (VolumeMeshColorQuantity *this,string *name,VolumeMesh *mesh_,string *definedOn_,
          vector<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
          *colorValues_)

{
  string *in_RCX;
  string *in_RSI;
  undefined8 *in_RDI;
  string *in_R8;
  vector<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
  *unaff_retaddr;
  VolumeMeshColorQuantity *in_stack_00000008;
  ColorQuantity<polyscope::VolumeMeshColorQuantity> *in_stack_00000010;
  string local_48 [23];
  undefined1 in_stack_ffffffffffffffcf;
  VolumeMesh *in_stack_ffffffffffffffd0;
  string *this_00;
  
  this_00 = in_RCX;
  std::__cxx11::string::string(local_48,in_RSI);
  VolumeMeshQuantity::VolumeMeshQuantity
            ((VolumeMeshQuantity *)this_00,in_R8,in_stack_ffffffffffffffd0,
             (bool)in_stack_ffffffffffffffcf);
  std::__cxx11::string::~string(local_48);
  *in_RDI = &PTR__VolumeMeshColorQuantity_0098ea88;
  ColorQuantity<polyscope::VolumeMeshColorQuantity>::ColorQuantity
            (in_stack_00000010,in_stack_00000008,unaff_retaddr);
  *in_RDI = &PTR__VolumeMeshColorQuantity_0098ea88;
  std::__cxx11::string::string((string *)(in_RDI + 0x55),in_RCX);
  std::shared_ptr<polyscope::render::ShaderProgram>::shared_ptr
            ((shared_ptr<polyscope::render::ShaderProgram> *)0x4d61c0);
  std::shared_ptr<polyscope::render::ShaderProgram>::shared_ptr
            ((shared_ptr<polyscope::render::ShaderProgram> *)0x4d61d1);
  return;
}

Assistant:

VolumeMeshColorQuantity::VolumeMeshColorQuantity(std::string name, VolumeMesh& mesh_, std::string definedOn_,
                                                 const std::vector<glm::vec3>& colorValues_)
    : VolumeMeshQuantity(name, mesh_, true), ColorQuantity(*this, colorValues_), definedOn(definedOn_) {}